

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O2

Msat_Clause_t * Msat_SolverPropagate(Msat_Solver_t *p)

{
  ABC_INT64_T *pAVar1;
  Msat_Clause_t *pMVar2;
  ulong uVar3;
  Msat_ClauseVec_t **ppMVar4;
  uint Lit;
  uint uVar5;
  int iVar6;
  Msat_Clause_t **ppMVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  Msat_Lit_t Lit_out;
  int local_68;
  uint local_64;
  Msat_ClauseVec_t **local_60;
  Msat_Clause_t **local_58;
  ulong local_50;
  Msat_Solver_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_60 = p->pvWatched;
  local_48 = p;
  do {
    Lit = Msat_QueueExtract(p->pQueue);
    ppMVar4 = local_60;
    if ((int)Lit < 0) {
      return (Msat_Clause_t *)0x0;
    }
    pAVar1 = &(p->Stats).nPropagations;
    *pAVar1 = *pAVar1 + 1;
    uVar10 = (ulong)Lit;
    uVar5 = Msat_ClauseVecReadSize(local_60[uVar10]);
    local_50 = uVar10;
    ppMVar7 = Msat_ClauseVecReadArray(ppMVar4[uVar10]);
    uVar10 = 0;
    local_38 = 0;
    if (0 < (int)uVar5) {
      local_38 = (ulong)uVar5;
    }
    local_68 = 0;
    local_58 = ppMVar7;
    local_40 = (ulong)uVar5;
    for (; local_38 != uVar10; uVar10 = uVar10 + 1) {
      pAVar1 = &(p->Stats).nInspects;
      *pAVar1 = *pAVar1 + 1;
      local_64 = 0xffffffff;
      iVar6 = Msat_ClausePropagate(*ppMVar7,Lit,p->pAssigns,(Msat_Lit_t *)&local_64);
      lVar9 = (long)local_68;
      if (iVar6 == 0) {
        iVar6 = Msat_SolverEnqueue(p,local_64,*ppMVar7);
        pMVar2 = *ppMVar7;
        if (iVar6 == 0) {
          uVar3 = local_40;
          if ((int)local_40 <= (int)uVar10) {
            uVar3 = uVar10;
          }
          iVar6 = ((int)uVar3 + local_68) - (int)uVar10;
          for (lVar8 = 0; iVar6 - lVar9 != lVar8; lVar8 = lVar8 + 1) {
            local_58[lVar9 + lVar8] = *ppMVar7;
            ppMVar7 = ppMVar7 + 1;
          }
          Msat_ClauseVecShrink(local_60[local_50],iVar6);
          Msat_QueueClear(local_48->pQueue);
          return pMVar2;
        }
        local_68 = local_68 + 1;
        local_58[lVar9] = pMVar2;
        p = local_48;
      }
      else if ((int)local_64 < 0) {
        local_68 = local_68 + 1;
        local_58[lVar9] = *ppMVar7;
      }
      else {
        Msat_ClauseVecPush(local_60[local_64],*ppMVar7);
      }
      ppMVar7 = ppMVar7 + 1;
    }
    Msat_ClauseVecShrink(local_60[local_50],local_68);
  } while( true );
}

Assistant:

Msat_Clause_t * Msat_SolverPropagate( Msat_Solver_t * p )
{
    Msat_ClauseVec_t ** pvWatched = p->pvWatched;
    Msat_Clause_t ** pClauses;
    Msat_Clause_t * pConflict;
    Msat_Lit_t Lit, Lit_out;
    int i, j, nClauses;

    // propagate all the literals in the queue
    while ( (Lit = Msat_QueueExtract( p->pQueue )) >= 0 )
    {
        p->Stats.nPropagations++;
        // get the clauses watched by this literal
        nClauses = Msat_ClauseVecReadSize( pvWatched[Lit] );
        pClauses = Msat_ClauseVecReadArray( pvWatched[Lit] );
        // go through the watched clauses and decide what to do with them
        for ( i = j = 0; i < nClauses; i++ )
        {
            p->Stats.nInspects++;
            // clear the returned literal
            Lit_out = -1;
            // propagate the clause
            if ( !Msat_ClausePropagate( pClauses[i], Lit, p->pAssigns, &Lit_out ) )
            {   // the clause is unit
                // "Lit_out" contains the new assignment to be enqueued
                if ( Msat_SolverEnqueue( p, Lit_out, pClauses[i] ) ) 
                { // consistent assignment 
                    // no changes to the implication queue; the watch is the same too
                    pClauses[j++] = pClauses[i];
                    continue;
                }
                // remember the reason of conflict (will be returned)
                pConflict = pClauses[i];
                // leave the remaning clauses in the same watched list
                for ( ; i < nClauses; i++ )
                    pClauses[j++] = pClauses[i];
                Msat_ClauseVecShrink( pvWatched[Lit], j );
                // clear the propagation queue
                Msat_QueueClear( p->pQueue );
                return pConflict;
            }
            // the clause is not unit
            // in this case "Lit_out" contains the new watch if it has changed
            if ( Lit_out >= 0 )
                Msat_ClauseVecPush( pvWatched[Lit_out], pClauses[i] );
            else // the watch did not change
                pClauses[j++] = pClauses[i];
        }
        Msat_ClauseVecShrink( pvWatched[Lit], j );
    }
    return NULL;
}